

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Calendar::handleGetExtendedYearFromWeekFields(Calendar *this,int32_t yearWoy,int32_t woy)

{
  bool bVar1;
  byte bVar2;
  UCalendarDateFields UVar3;
  int32_t iVar4;
  EDaysOfWeek EVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int local_44;
  int32_t jd;
  int iStack_38;
  UBool jan1InPrevYear;
  int32_t minDays;
  int32_t first;
  int32_t nextJan1Start;
  int32_t jan1Start;
  int32_t firstDayOfWeek;
  int32_t dowLocal;
  UCalendarDateFields bestField;
  int32_t woy_local;
  int32_t yearWoy_local;
  Calendar *this_local;
  
  UVar3 = resolveFields(this,(UFieldResolutionTable *)kDatePrecedence);
  iVar4 = getLocalDOW(this);
  EVar5 = getFirstDayOfWeek(this);
  iVar6 = (*(this->super_UObject)._vptr_UObject[0x21])(this,(ulong)(uint)yearWoy,0);
  iVar7 = (*(this->super_UObject)._vptr_UObject[0x21])(this,(ulong)(yearWoy + 1),0);
  bVar2 = julianDayToDayOfWeek((double)(iVar6 + 1));
  iStack_38 = bVar2 - EVar5;
  if (iStack_38 < 0) {
    iStack_38 = iStack_38 + 7;
  }
  bVar2 = getMinimalDaysInFirstWeek(this);
  bVar1 = (int)(uint)bVar2 <= 7 - iStack_38;
  this_local._4_4_ = yearWoy;
  if (UVar3 == UCAL_WEEK_OF_YEAR) {
    if (woy == 1) {
      if ((bVar1) && (iVar4 < iStack_38)) {
        this_local._4_4_ = yearWoy + -1;
      }
    }
    else {
      iVar8 = (*(this->super_UObject)._vptr_UObject[0x14])(this,3);
      if (iVar8 <= woy) {
        local_44 = iVar6 + (7 - iStack_38) + (woy + -1) * 7 + iVar4;
        if (bVar1) {
          local_44 = local_44 + -7;
        }
        if (iVar7 <= local_44 + 1) {
          this_local._4_4_ = yearWoy + 1;
        }
      }
    }
  }
  else if (UVar3 == UCAL_DATE) {
    iVar4 = internalGet(this,UCAL_MONTH);
    if ((iVar4 == 0) && (iVar6 = (*(this->super_UObject)._vptr_UObject[0x14])(this,3), iVar6 <= woy)
       ) {
      this_local._4_4_ = yearWoy + 1;
    }
    else if ((woy == 1) && (iVar4 = internalGet(this,UCAL_MONTH), iVar4 != 0)) {
      this_local._4_4_ = yearWoy + -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t Calendar::handleGetExtendedYearFromWeekFields(int32_t yearWoy, int32_t woy)
{
    // We have UCAL_YEAR_WOY and UCAL_WEEK_OF_YEAR - from those, determine
    // what year we fall in, so that other code can set it properly.
    // (code borrowed from computeWeekFields and handleComputeJulianDay)
    //return yearWoy;

    // First, we need a reliable DOW.
    UCalendarDateFields bestField = resolveFields(kDatePrecedence); // !! Note: if subclasses have a different table, they should override handleGetExtendedYearFromWeekFields

    // Now, a local DOW
    int32_t dowLocal = getLocalDOW(); // 0..6
    int32_t firstDayOfWeek = getFirstDayOfWeek(); // Localized fdw
    int32_t jan1Start = handleComputeMonthStart(yearWoy, 0, FALSE);
    int32_t nextJan1Start = handleComputeMonthStart(yearWoy+1, 0, FALSE); // next year's Jan1 start

    // At this point julianDay is the 0-based day BEFORE the first day of
    // January 1, year 1 of the given calendar.  If julianDay == 0, it
    // specifies (Jan. 1, 1) - 1, in whatever calendar we are using (Julian
    // or Gregorian). (or it is before the month we are in, if useMonth is True)

    // At this point we need to process the WEEK_OF_MONTH or
    // WEEK_OF_YEAR, which are similar, or the DAY_OF_WEEK_IN_MONTH.
    // First, perform initial shared computations.  These locate the
    // first week of the period.

    // Get the 0-based localized DOW of day one of the month or year.
    // Valid range 0..6.
    int32_t first = julianDayToDayOfWeek(jan1Start + 1) - firstDayOfWeek;
    if (first < 0) {
        first += 7;
    }

    //// (nextFirst was not used below)
    // int32_t nextFirst = julianDayToDayOfWeek(nextJan1Start + 1) - firstDayOfWeek;
    // if (nextFirst < 0) {
    //     nextFirst += 7;
    //}

    int32_t minDays = getMinimalDaysInFirstWeek();
    UBool jan1InPrevYear = FALSE;  // January 1st in the year of WOY is the 1st week?  (i.e. first week is < minimal )
    //UBool nextJan1InPrevYear = FALSE; // January 1st of Year of WOY + 1 is in the first week?

    if((7 - first) < minDays) {
        jan1InPrevYear = TRUE;
    }

    //   if((7 - nextFirst) < minDays) {
    //     nextJan1InPrevYear = TRUE;
    //   }

    switch(bestField) {
    case UCAL_WEEK_OF_YEAR:
        if(woy == 1) {
            if(jan1InPrevYear == TRUE) {
                // the first week of January is in the previous year
                // therefore WOY1 is always solidly within yearWoy
                return yearWoy;
            } else {
                // First WOY is split between two years
                if( dowLocal < first) { // we are prior to Jan 1
                    return yearWoy-1; // previous year
                } else {
                    return yearWoy; // in this year
                }
            }
        } else if(woy >= getLeastMaximum(bestField)) {
            // we _might_ be in the last week..
            int32_t jd =  // Calculate JD of our target day:
                jan1Start +  // JD of Jan 1
                (7-first) + //  days in the first week (Jan 1.. )
                (woy-1)*7 + // add the weeks of the year
                dowLocal;   // the local dow (0..6) of last week
            if(jan1InPrevYear==FALSE) {
                jd -= 7; // woy already includes Jan 1's week.
            }

            if( (jd+1) >= nextJan1Start ) {
                // we are in week 52 or 53 etc. - actual year is yearWoy+1
                return yearWoy+1;
            } else {
                // still in yearWoy;
                return yearWoy;
            }
        } else {
            // we're not possibly in the last week -must be ywoy
            return yearWoy;
        }

    case UCAL_DATE:
        if((internalGet(UCAL_MONTH)==0) &&
            (woy >= getLeastMaximum(UCAL_WEEK_OF_YEAR))) {
                return yearWoy+1; // month 0, late woy = in the next year
            } else if(woy==1) {
                //if(nextJan1InPrevYear) {
                if(internalGet(UCAL_MONTH)==0) {
                    return yearWoy;
                } else {
                    return yearWoy-1;
                }
                //}
            }

            //(internalGet(UCAL_DATE) <= (7-first)) /* && in minDow  */ ) {
            //within 1st week and in this month..
            //return yearWoy+1;
            return yearWoy;

    default: // assume the year is appropriate
        return yearWoy;
    }
}